

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<short,double,duckdb::ArgMinMaxState<short,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<short,_double> *state,short *x,double *y,AggregateBinaryInput *binary
               )

{
  bool bVar1;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    Execute<short,double,duckdb::ArgMinMaxState<short,double>>(state,*x,*y,binary);
    return;
  }
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&binary->right_mask->super_TemplatedValidityMask<unsigned_long>,binary->ridx);
  if (bVar1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
    (state->super_ArgMinMaxStateBase).arg_null = !bVar1;
    if (bVar1) {
      state->arg = *x;
    }
    state->value = *y;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}